

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

void ** Extra_ArrayAlloc(int nCols,int nRows,int Size)

{
  void **ppvVar1;
  int local_2c;
  int i;
  char *pBuffer;
  void **pRes;
  int Size_local;
  int nRows_local;
  int nCols_local;
  
  if (((0 < nCols) && (0 < nRows)) && (0 < Size)) {
    ppvVar1 = (void **)malloc((long)nCols * ((long)(nRows * Size) + 8));
    *ppvVar1 = ppvVar1 + nCols;
    for (local_2c = 1; local_2c < nCols; local_2c = local_2c + 1) {
      ppvVar1[local_2c] = (void *)((long)*ppvVar1 + (long)(local_2c * nRows * Size));
    }
    return ppvVar1;
  }
  __assert_fail("nCols > 0 && nRows > 0 && Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilMisc.c"
                ,0x375,"void **Extra_ArrayAlloc(int, int, int)");
}

Assistant:

void ** Extra_ArrayAlloc( int nCols, int nRows, int Size )
{
    void ** pRes;
    char * pBuffer;
    int i;
    assert( nCols > 0 && nRows > 0 && Size > 0 );
    pBuffer = ABC_ALLOC( char, nCols * (sizeof(void *) + nRows * Size) );
    pRes = (void **)pBuffer;
    pRes[0] = pBuffer + nCols * sizeof(void *);
    for ( i = 1; i < nCols; i++ )
        pRes[i] = (void *)((char *)pRes[0] + i * nRows * Size);
    return pRes;
}